

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::wrapupSwitchSubsequence
          (TParseContext *this,TIntermAggregate *statements,TIntermNode *branchNode)

{
  int iVar1;
  int iVar2;
  reference ppTVar3;
  size_type sVar4;
  undefined4 extraout_var;
  reference ppTVar5;
  undefined4 extraout_var_00;
  TIntermTyped *pTVar6;
  TIntermBranch *this_00;
  TIntermTyped *pTVar7;
  undefined8 uVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TConstUnionArray *pTVar9;
  TConstUnion *pTVar10;
  undefined4 extraout_var_04;
  TIntermTyped *newExpression;
  TIntermTyped *prevExpression;
  TIntermBranch *prevBranch;
  TIntermNode *pTStack_30;
  uint s;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *local_28;
  TIntermSequence *switchSequence;
  TIntermNode *branchNode_local;
  TIntermAggregate *statements_local;
  TParseContext *this_local;
  
  switchSequence = (TIntermSequence *)branchNode;
  branchNode_local = (TIntermNode *)statements;
  statements_local = (TIntermAggregate *)this;
  ppTVar3 = std::__cxx11::
            list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
            ::back(&(this->super_TParseContextBase).switchSequenceStack.
                    super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
                  );
  local_28 = &(*ppTVar3)->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>;
  if (branchNode_local != (TIntermNode *)0x0) {
    sVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(local_28);
    if (sVar4 == 0) {
      iVar1 = (**branchNode_local->_vptr_TIntermNode)();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,CONCAT44(extraout_var,iVar1),
                 "cannot have statements before first case/default label","switch","");
    }
    (*branchNode_local->_vptr_TIntermNode[0x31])(branchNode_local,1);
    pTStack_30 = branchNode_local;
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              (local_28,&stack0xffffffffffffffd0);
  }
  if (switchSequence != (TIntermSequence *)0x0) {
    for (prevBranch._4_4_ = 0;
        sVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(local_28),
        prevBranch._4_4_ < sVar4; prevBranch._4_4_ = prevBranch._4_4_ + 1) {
      ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          (local_28,(ulong)prevBranch._4_4_);
      iVar1 = (*(*ppTVar5)->_vptr_TIntermNode[0xd])();
      if ((TIntermBranch *)CONCAT44(extraout_var_00,iVar1) != (TIntermBranch *)0x0) {
        pTVar6 = TIntermBranch::getExpression((TIntermBranch *)CONCAT44(extraout_var_00,iVar1));
        this_00 = (TIntermBranch *)
                  (*(code *)(switchSequence->
                            super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                            ._M_impl.super__Tp_alloc_type.allocator[1].alignment)();
        pTVar7 = TIntermBranch::getExpression(this_00);
        if ((pTVar6 == (TIntermTyped *)0x0) && (pTVar7 == (TIntermTyped *)0x0)) {
          uVar8 = (*(code *)((switchSequence->
                             super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                             ._M_impl.super__Tp_alloc_type.allocator)->pageSize)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,uVar8,"duplicate label","default","");
        }
        else if ((pTVar6 != (TIntermTyped *)0x0) &&
                (((pTVar7 != (TIntermTyped *)0x0 &&
                  (iVar1 = (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[5])(),
                  CONCAT44(extraout_var_01,iVar1) != 0)) &&
                 (iVar1 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[5])(),
                 CONCAT44(extraout_var_02,iVar1) != 0)))) {
          iVar1 = (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[5])();
          pTVar9 = TIntermConstantUnion::getConstArray
                             ((TIntermConstantUnion *)CONCAT44(extraout_var_03,iVar1));
          pTVar10 = TConstUnionArray::operator[](pTVar9,0);
          iVar1 = TConstUnion::getIConst(pTVar10);
          iVar2 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[5])();
          pTVar9 = TIntermConstantUnion::getConstArray
                             ((TIntermConstantUnion *)CONCAT44(extraout_var_04,iVar2));
          pTVar10 = TConstUnionArray::operator[](pTVar9,0);
          iVar2 = TConstUnion::getIConst(pTVar10);
          if (iVar1 == iVar2) {
            uVar8 = (*(code *)((switchSequence->
                               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>)
                               .
                               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                               ._M_impl.super__Tp_alloc_type.allocator)->pageSize)();
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,uVar8,"duplicated value","case","");
          }
        }
      }
    }
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
              (local_28,(value_type *)&switchSequence);
  }
  return;
}

Assistant:

void TParseContext::wrapupSwitchSubsequence(TIntermAggregate* statements, TIntermNode* branchNode)
{
    TIntermSequence* switchSequence = switchSequenceStack.back();

    if (statements) {
        if (switchSequence->size() == 0)
            error(statements->getLoc(), "cannot have statements before first case/default label", "switch", "");
        statements->setOperator(EOpSequence);
        switchSequence->push_back(statements);
    }
    if (branchNode) {
        // check all previous cases for the same label (or both are 'default')
        for (unsigned int s = 0; s < switchSequence->size(); ++s) {
            TIntermBranch* prevBranch = (*switchSequence)[s]->getAsBranchNode();
            if (prevBranch) {
                TIntermTyped* prevExpression = prevBranch->getExpression();
                TIntermTyped* newExpression = branchNode->getAsBranchNode()->getExpression();
                if (prevExpression == nullptr && newExpression == nullptr)
                    error(branchNode->getLoc(), "duplicate label", "default", "");
                else if (prevExpression != nullptr &&
                          newExpression != nullptr &&
                         prevExpression->getAsConstantUnion() &&
                          newExpression->getAsConstantUnion() &&
                         prevExpression->getAsConstantUnion()->getConstArray()[0].getIConst() ==
                          newExpression->getAsConstantUnion()->getConstArray()[0].getIConst())
                    error(branchNode->getLoc(), "duplicated value", "case", "");
            }
        }
        switchSequence->push_back(branchNode);
    }
}